

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O3

cl_int clMemFreeINTEL_EMU(cl_context context,void *ptr)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  CLIntercept *pCVar2;
  int iVar3;
  mapped_type *this;
  _Base_ptr p_Var4;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_> __dest
  ;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  pointer ppvVar7;
  cl_int cVar8;
  pointer __src;
  pointer *pppvVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::_Rb_tree_iterator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
  pVar10;
  key_type pvStack_38;
  cl_context p_Stack_30;
  
  pCVar2 = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Config).Emulate_cl_intel_unified_shared_memory != true)) {
    return -0x3b;
  }
  __mutex = &g_pIntercept->m_Mutex;
  pvStack_38 = ptr;
  p_Stack_30 = context;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar5 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  this = std::
         map<_cl_context_*,_CLIntercept::SUSMContextInfo,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SUSMContextInfo>_>_>
         ::operator[](&pCVar2->m_USMContextInfoMap,&p_Stack_30);
  p_Var6 = (this->AllocMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  cVar8 = -0x26;
  if (p_Var6 == (_Base_ptr)0x0) goto LAB_0018a65a;
  p_Var1 = &(this->AllocMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var1->_M_header;
  do {
    if (*(void **)(p_Var6 + 1) >= ptr) {
      p_Var4 = p_Var6;
    }
    p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < ptr];
  } while (p_Var6 != (_Base_ptr)0x0);
  if (((_Rb_tree_header *)p_Var4 == p_Var1) || (ptr < *(void **)(p_Var4 + 1))) goto LAB_0018a65a;
  iVar3 = *(int *)&p_Var4[1]._M_parent;
  if (iVar3 == 0x4197) {
    __dest = std::
             __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                       ((this->HostAllocVector).
                        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (this->HostAllocVector).
                        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish,&pvStack_38);
    pppvVar9 = &(this->HostAllocVector).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    __src = __dest._M_current + 1;
    ppvVar7 = (this->HostAllocVector).
              super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
LAB_0018a60e:
    if (__src != ppvVar7) {
      memmove(__dest._M_current,__src,(long)ppvVar7 - (long)__src);
      ppvVar7 = *pppvVar9;
    }
    *pppvVar9 = ppvVar7 + -1;
  }
  else {
    if (iVar3 == 0x4198) {
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                         ((this->DeviceAllocVector).
                          super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->DeviceAllocVector).
                          super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,&pvStack_38);
      pppvVar9 = &(this->DeviceAllocVector).
                  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      __src = __dest._M_current + 1;
      ppvVar7 = (this->DeviceAllocVector).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      goto LAB_0018a60e;
    }
    if (iVar3 == 0x4199) {
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                         ((this->SharedAllocVector).
                          super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->SharedAllocVector).
                          super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,&pvStack_38);
      pppvVar9 = &(this->SharedAllocVector).
                  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      __src = __dest._M_current + 1;
      ppvVar7 = (this->SharedAllocVector).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      goto LAB_0018a60e;
    }
  }
  pVar10 = std::
           _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
           ::equal_range((_Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
                          *)this,&pvStack_38);
  std::
  _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
  ::_M_erase_aux((_Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
                  *)this,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
  (*(pCVar2->m_Dispatch).clSVMFree)(p_Stack_30,pvStack_38);
  pvStack_38 = (void *)0x0;
  cVar8 = 0;
LAB_0018a65a:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return cVar8;
}

Assistant:

cl_int CL_API_CALL clMemFreeINTEL_EMU(
    cl_context context,
    void* ptr)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory )
    {
        return pIntercept->emulatedMemFree(
            context,
            ptr );
    }

    return CL_INVALID_OPERATION;
}